

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PretransformVertices.cpp
# Opt level: O0

void __thiscall
Assimp::PretransformVertices::BuildMeshRefCountArray
          (PretransformVertices *this,aiNode *nd,uint *refs)

{
  uint local_28;
  uint local_24;
  uint i_1;
  uint i;
  uint *refs_local;
  aiNode *nd_local;
  PretransformVertices *this_local;
  
  for (local_24 = 0; local_24 < nd->mNumMeshes; local_24 = local_24 + 1) {
    refs[nd->mMeshes[local_24]] = refs[nd->mMeshes[local_24]] + 1;
  }
  for (local_28 = 0; local_28 < nd->mNumChildren; local_28 = local_28 + 1) {
    BuildMeshRefCountArray(this,nd->mChildren[local_28],refs);
  }
  return;
}

Assistant:

void PretransformVertices::BuildMeshRefCountArray(const aiNode *nd, unsigned int *refs) const {
	for (unsigned int i = 0; i < nd->mNumMeshes; ++i)
		refs[nd->mMeshes[i]]++;

	// call children
	for (unsigned int i = 0; i < nd->mNumChildren; ++i)
		BuildMeshRefCountArray(nd->mChildren[i], refs);
}